

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioApi.c
# Opt level: O2

int Mio_LibraryReadGateNameMax(Mio_Library_t *pLib)

{
  Mio_Gate_t *pMVar1;
  int iVar2;
  size_t sVar3;
  Mio_Gate_t **ppMVar4;
  int iVar5;
  
  ppMVar4 = &pLib->pGates;
  iVar5 = 0;
  while( true ) {
    pMVar1 = *ppMVar4;
    if (pMVar1 == (Mio_Gate_t *)0x0) break;
    sVar3 = strlen(pMVar1->pName);
    iVar2 = (int)sVar3;
    if ((int)sVar3 < iVar5) {
      iVar2 = iVar5;
    }
    ppMVar4 = &pMVar1->pNext;
    iVar5 = iVar2;
  }
  return iVar5;
}

Assistant:

int Mio_LibraryReadGateNameMax( Mio_Library_t * pLib )
{
    Mio_Gate_t * pGate;
    int LenMax = 0, LenCur;
    Mio_LibraryForEachGate( pLib, pGate )
    {
        LenCur = strlen( Mio_GateReadName(pGate) );
        if ( LenMax < LenCur )
            LenMax = LenCur;
    }
    return LenMax;
}